

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerHLSL::emit_fixup(CompilerHLSL *this)

{
  bool bVar1;
  
  bVar1 = Compiler::is_vertex_like_shader((Compiler *)this);
  if ((bVar1) && (((this->super_CompilerGLSL).super_Compiler.active_output_builtins.lower & 1) != 0)
     ) {
    if ((this->hlsl_options).shader_model < 0x1f) {
      CompilerGLSL::statement<char_const(&)[64]>
                (&this->super_CompilerGLSL,
                 (char (*) [64])"gl_Position.x = gl_Position.x - gl_HalfPixel.x * gl_Position.w;");
      CompilerGLSL::statement<char_const(&)[64]>
                (&this->super_CompilerGLSL,
                 (char (*) [64])"gl_Position.y = gl_Position.y + gl_HalfPixel.y * gl_Position.w;");
    }
    if ((this->super_CompilerGLSL).options.vertex.flip_vert_y == true) {
      CompilerGLSL::statement<char_const(&)[32]>
                (&this->super_CompilerGLSL,(char (*) [32])"gl_Position.y = -gl_Position.y;");
    }
    if ((this->super_CompilerGLSL).options.vertex.fixup_clipspace == true) {
      CompilerGLSL::statement<char_const(&)[55]>
                (&this->super_CompilerGLSL,
                 (char (*) [55])"gl_Position.z = (gl_Position.z + gl_Position.w) * 0.5;");
      return;
    }
  }
  return;
}

Assistant:

void CompilerHLSL::emit_fixup()
{
	if (is_vertex_like_shader() && active_output_builtins.get(BuiltInPosition))
	{
		// Do various mangling on the gl_Position.
		if (hlsl_options.shader_model <= 30)
		{
			statement("gl_Position.x = gl_Position.x - gl_HalfPixel.x * "
			          "gl_Position.w;");
			statement("gl_Position.y = gl_Position.y + gl_HalfPixel.y * "
			          "gl_Position.w;");
		}

		if (options.vertex.flip_vert_y)
			statement("gl_Position.y = -gl_Position.y;");
		if (options.vertex.fixup_clipspace)
			statement("gl_Position.z = (gl_Position.z + gl_Position.w) * 0.5;");
	}
}